

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_parsecfg.c
# Opt level: O1

int parseconfig(char *filename,GlobalConfig *global)

{
  byte bVar1;
  OperationConfig *pOVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ParameterError res;
  char *pcVar6;
  size_t sVar7;
  FILE *__stream;
  size_t sVar8;
  byte *__s;
  char *pcVar9;
  byte *pbVar10;
  byte *pbVar11;
  OperationConfig *config;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  _Bool usedarg;
  char filebuffer [512];
  char buf [4096];
  _Bool local_1261;
  FILE *local_1260;
  int local_1258;
  uint local_1254;
  OperationConfig *local_1250;
  char *local_1248;
  GlobalConfig *local_1240;
  char local_1238 [512];
  char local_1038 [4104];
  
  local_1261 = false;
  pOVar2 = global->first;
  if ((filename == (char *)0x0) || (*filename == '\0')) {
    pcVar6 = homedir();
    if (pcVar6 == (char *)0x0) {
      filename = ".curlrc";
    }
    else {
      sVar7 = strlen(pcVar6);
      if (sVar7 < 0x1f9) {
        filename = local_1238;
        curl_msnprintf(filename,0x200,"%s%s%s",pcVar6,"/",".curlrc");
      }
      else {
        filename = ".curlrc";
      }
      free(pcVar6);
    }
  }
  iVar5 = strcmp(filename,"-");
  __stream = _stdin;
  if (iVar5 != 0) {
    __stream = fopen64(filename,"r");
  }
  if (__stream == (FILE *)0x0) {
    local_1258 = 1;
  }
  else {
    local_1258 = 0;
    local_1254 = 0;
    local_1260 = __stream;
    local_1250 = pOVar2;
    local_1248 = filename;
    local_1240 = global;
    do {
      pcVar6 = fgets(local_1038,0x1000,__stream);
      __s = (byte *)0x0;
      pbVar12 = __s;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        do {
          if (pbVar12 == (byte *)0x0) {
            __s = (byte *)strdup(local_1038);
            if (__s == (byte *)0x0) goto LAB_00118e0f;
          }
          else {
            sVar7 = strlen((char *)pbVar12);
            sVar8 = strlen(local_1038);
            __s = (byte *)realloc(pbVar12,sVar7 + sVar8 + 1);
            if (__s == (byte *)0x0) {
              free(pbVar12);
LAB_00118e0f:
              __s = (byte *)0x0;
              goto LAB_00118e12;
            }
            strcpy((char *)(__s + sVar7),local_1038);
          }
          pcVar6 = strchr((char *)__s,10);
        } while ((pcVar6 == (char *)0x0) &&
                (pcVar9 = fgets(local_1038,0x1000,__stream), pbVar12 = __s, pcVar9 != (char *)0x0));
      }
      if (pcVar6 != (char *)0x0) {
        *pcVar6 = '\0';
      }
LAB_00118e12:
      if (__s == (byte *)0x0) break;
      bVar1 = *__s;
      pbVar12 = __s;
      while ((bVar1 != 0 && (iVar5 = Curl_isspace((uint)bVar1), iVar5 != 0))) {
        bVar1 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
      }
      local_1254 = local_1254 + 1;
      bVar1 = *pbVar12;
      if (((ulong)bVar1 < 0x30) && ((0x840800002401U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        bVar3 = false;
        __stream = local_1260;
      }
      else {
        bVar4 = *pbVar12;
        for (pbVar13 = pbVar12;
            ((bVar4 != 0 && (iVar5 = Curl_isspace((uint)bVar4), iVar5 == 0)) &&
            ((bVar1 == 0x2d || ((*pbVar13 != 0x3a && (*pbVar13 != 0x3d)))))); pbVar13 = pbVar13 + 1)
        {
          bVar4 = pbVar13[1];
        }
        if (*pbVar13 != 0) {
          *pbVar13 = 0;
          pbVar13 = pbVar13 + 1;
        }
        bVar4 = *pbVar13;
        for (; (bVar4 != 0 &&
               ((iVar5 = Curl_isspace((uint)bVar4), iVar5 != 0 ||
                ((bVar1 != 0x2d && ((*pbVar13 == 0x3d || (*pbVar13 == 0x3a))))))));
            pbVar13 = pbVar13 + 1) {
          bVar4 = pbVar13[1];
        }
        bVar1 = *pbVar13;
        if (bVar1 == 0x22) {
          sVar7 = strlen((char *)(pbVar13 + 1));
          pbVar10 = (byte *)malloc(sVar7 + 1);
          pbVar11 = pbVar10;
          pbVar13 = pbVar13 + 1;
          if (pbVar10 == (byte *)0x0) {
            bVar3 = true;
            local_1258 = 1;
            __stream = local_1260;
            goto LAB_00118e62;
          }
LAB_00118f29:
          while( true ) {
            pbVar14 = pbVar13;
            bVar4 = *pbVar14;
            if (bVar4 == 0x5c) {
              bVar4 = pbVar14[1];
              switch(bVar4) {
              case 0x6e:
                bVar4 = 10;
                break;
              case 0x6f:
              case 0x70:
              case 0x71:
              case 0x73:
              case 0x75:
                break;
              case 0x72:
                bVar4 = 0xd;
                break;
              case 0x74:
                bVar4 = 9;
                break;
              case 0x76:
                bVar4 = 0xb;
                break;
              default:
                goto switchD_00118f6a_default;
              }
              goto switchD_00118f6a_caseD_6f;
            }
            if ((bVar4 == 0) || (bVar4 == 0x22)) break;
            *pbVar11 = bVar4;
            pbVar11 = pbVar11 + 1;
            pbVar13 = pbVar14 + 1;
          }
          *pbVar11 = 0;
        }
        else {
          bVar4 = *pbVar13;
          pbVar10 = pbVar13;
          while ((bVar4 != 0 && (iVar5 = Curl_isspace((uint)bVar4), iVar5 == 0))) {
            bVar4 = pbVar10[1];
            pbVar10 = pbVar10 + 1;
          }
          if (*pbVar10 != 0) {
            *pbVar10 = 0;
            do {
              pbVar10 = pbVar10 + 1;
              if (*pbVar10 == 0) break;
              iVar5 = Curl_isspace((uint)*pbVar10);
            } while (iVar5 != 0);
            if ((0x23 < (ulong)*pbVar10) || ((0x800002401U >> ((ulong)*pbVar10 & 0x3f) & 1) == 0)) {
              warnf(local_1250->global,
                    "%s:%d: warning: \'%s\' uses unquoted white space in the line that may cause side-effects!\n"
                    ,local_1248,(ulong)local_1254,pbVar12);
            }
          }
          pbVar10 = (byte *)0x0;
          global = local_1240;
          if (*pbVar13 != 0) {
            pbVar10 = pbVar13;
          }
        }
        __stream = local_1260;
        res = getparameter((char *)pbVar12,(char *)pbVar10,&local_1261,global,local_1250);
        if ((pbVar10 != (byte *)0x0) && (res == PARAM_OK)) {
          if (*pbVar10 == 0) {
            res = PARAM_OK;
          }
          else {
            res = (local_1261 ^ 1) * 9;
          }
        }
        if (res == PARAM_NEXT_OPERATION) {
          res = PARAM_NEXT_OPERATION;
          if ((local_1250->url_list != (getout *)0x0) && (local_1250->url_list->url != (char *)0x0))
          {
            config = (OperationConfig *)malloc(0x4a0);
            pOVar2 = local_1250;
            local_1250->next = config;
            if (config == (OperationConfig *)0x0) {
              res = PARAM_NO_MEM;
              __stream = local_1260;
            }
            else {
              config_init(config);
              local_1250 = pOVar2->next;
              local_1250->easy = local_1240->easy;
              local_1250->global = local_1240;
              local_1240->last = local_1250;
              local_1250->prev = pOVar2;
              __stream = local_1260;
            }
          }
        }
        pcVar6 = local_1248;
        if ((res != PARAM_OK) && (res != PARAM_NEXT_OPERATION)) {
          iVar5 = strcmp(local_1248,"-");
          if (iVar5 == 0) {
            pcVar6 = "<stdin>";
          }
          __stream = local_1260;
          local_1248 = pcVar6;
          if (res - PARAM_GOT_EXTRA_PARAMETER < 0xfffffffc) {
            pcVar9 = param2text(res);
            warnf(local_1250->global,"%s:%d: warning: \'%s\' %s\n",pcVar6,(ulong)local_1254,pbVar12,
                  pcVar9);
            __stream = local_1260;
          }
        }
        global = local_1240;
        if (bVar1 == 0x22) {
          free(pbVar10);
        }
        bVar3 = false;
      }
LAB_00118e62:
      free(__s);
    } while (!bVar3);
    if (__stream != _stdin) {
      fclose(__stream);
    }
  }
  return local_1258;
switchD_00118f6a_default:
  pbVar13 = pbVar14 + 1;
  if (bVar4 != 0) {
switchD_00118f6a_caseD_6f:
    *pbVar11 = bVar4;
    pbVar11 = pbVar11 + 1;
    pbVar13 = pbVar14 + 2;
  }
  goto LAB_00118f29;
}

Assistant:

int parseconfig(const char *filename, struct GlobalConfig *global)
{
  FILE *file;
  char filebuffer[512];
  bool usedarg = FALSE;
  int rc = 0;
  struct OperationConfig *operation = global->first;

  if(!filename || !*filename) {
    /* NULL or no file name attempts to load .curlrc from the homedir! */

#ifndef __AMIGA__
    char *home = homedir();    /* portable homedir finder */
    filename = CURLRC;   /* sensible default */
    if(home) {
      if(strlen(home) < (sizeof(filebuffer) - strlen(CURLRC))) {
        snprintf(filebuffer, sizeof(filebuffer),
                 "%s%s%s", home, DIR_CHAR, CURLRC);

#ifdef WIN32
        /* Check if the file exists - if not, try CURLRC in the same
         * directory as our executable
         */
        file = fopen(filebuffer, FOPEN_READTEXT);
        if(file != NULL) {
          fclose(file);
          filename = filebuffer;
        }
        else {
          /* Get the filename of our executable. GetModuleFileName is
           * already declared via inclusions done in setup header file.
           * We assume that we are using the ASCII version here.
           */
          int n = GetModuleFileNameA(0, filebuffer, sizeof(filebuffer));
          if(n > 0 && n < (int)sizeof(filebuffer)) {
            /* We got a valid filename - get the directory part */
            char *lastdirchar = strrchr(filebuffer, '\\');
            if(lastdirchar) {
              size_t remaining;
              *lastdirchar = 0;
              /* If we have enough space, build the RC filename */
              remaining = sizeof(filebuffer) - strlen(filebuffer);
              if(strlen(CURLRC) < remaining - 1) {
                snprintf(lastdirchar, remaining,
                         "%s%s", DIR_CHAR, CURLRC);
                /* Don't bother checking if it exists - we do
                 * that later
                 */
                filename = filebuffer;
              }
            }
          }
        }
#else /* WIN32 */
        filename = filebuffer;
#endif /* WIN32 */
      }
      Curl_safefree(home); /* we've used it, now free it */
    }

# else /* __AMIGA__ */
    /* On AmigaOS all the config files are into env:
     */
    filename = "ENV:" CURLRC;

#endif
  }

  if(strcmp(filename, "-"))
    file = fopen(filename, FOPEN_READTEXT);
  else
    file = stdin;

  if(file) {
    char *line;
    char *aline;
    char *option;
    char *param;
    int lineno = 0;
    bool dashed_option;

    while(NULL != (aline = my_get_line(file))) {
      int res;
      bool alloced_param = FALSE;
      lineno++;
      line = aline;

      /* line with # in the first non-blank column is a comment! */
      while(*line && ISSPACE(*line))
        line++;

      switch(*line) {
      case '#':
      case '/':
      case '\r':
      case '\n':
      case '*':
      case '\0':
        Curl_safefree(aline);
        continue;
      }

      /* the option keywords starts here */
      option = line;

      /* the option starts with a dash? */
      dashed_option = option[0]=='-'?TRUE:FALSE;

      while(*line && !ISSPACE(*line) && !ISSEP(*line, dashed_option))
        line++;
      /* ... and has ended here */

      if(*line)
        *line++ = '\0'; /* zero terminate, we have a local copy of the data */

#ifdef DEBUG_CONFIG
      fprintf(stderr, "GOT: %s\n", option);
#endif

      /* pass spaces and separator(s) */
      while(*line && (ISSPACE(*line) || ISSEP(*line, dashed_option)))
        line++;

      /* the parameter starts here (unless quoted) */
      if(*line == '\"') {
        /* quoted parameter, do the quote dance */
        line++;
        param = malloc(strlen(line) + 1); /* parameter */
        if(!param) {
          /* out of memory */
          Curl_safefree(aline);
          rc = 1;
          break;
        }
        alloced_param = TRUE;
        (void)unslashquote(line, param);
      }
      else {
        param = line; /* parameter starts here */
        while(*line && !ISSPACE(*line))
          line++;

        if(*line) {
          *line = '\0'; /* zero terminate */

          /* to detect mistakes better, see if there's data following */
          line++;
          /* pass all spaces */
          while(*line && ISSPACE(*line))
            line++;

          switch(*line) {
          case '\0':
          case '\r':
          case '\n':
          case '#': /* comment */
            break;
          default:
            warnf(operation->global, "%s:%d: warning: '%s' uses unquoted "
                  "white space in the line that may cause side-effects!\n",
                  filename, lineno, option);
          }
        }
        if(!*param)
          /* do this so getparameter can check for required parameters.
             Otherwise it always thinks there's a parameter. */
          param = NULL;
      }

#ifdef DEBUG_CONFIG
      fprintf(stderr, "PARAM: \"%s\"\n",(param ? param : "(null)"));
#endif
      res = getparameter(option, param, &usedarg, global, operation);

      if(!res && param && *param && !usedarg)
        /* we passed in a parameter that wasn't used! */
        res = PARAM_GOT_EXTRA_PARAMETER;

      if(res == PARAM_NEXT_OPERATION) {
        if(operation->url_list && operation->url_list->url) {
          /* Allocate the next config */
          operation->next = malloc(sizeof(struct OperationConfig));
          if(operation->next) {
            /* Initialise the newly created config */
            config_init(operation->next);

            /* Copy the easy handle */
            operation->next->easy = global->easy;

            /* Set the global config pointer */
            operation->next->global = global;

            /* Update the last operation pointer */
            global->last = operation->next;

            /* Move onto the new config */
            operation->next->prev = operation;
            operation = operation->next;
          }
          else
            res = PARAM_NO_MEM;
        }
      }

      if(res != PARAM_OK && res != PARAM_NEXT_OPERATION) {
        /* the help request isn't really an error */
        if(!strcmp(filename, "-")) {
          filename = "<stdin>";
        }
        if(res != PARAM_HELP_REQUESTED &&
           res != PARAM_MANUAL_REQUESTED &&
           res != PARAM_VERSION_INFO_REQUESTED &&
           res != PARAM_ENGINES_REQUESTED) {
          const char *reason = param2text(res);
          warnf(operation->global, "%s:%d: warning: '%s' %s\n",
                filename, lineno, option, reason);
        }
      }

      if(alloced_param)
        Curl_safefree(param);

      Curl_safefree(aline);
    }
    if(file != stdin)
      fclose(file);
  }
  else
    rc = 1; /* couldn't open the file */

  return rc;
}